

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * gettxoutsetinfo(void)

{
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  RPCResults results;
  RPCExamples examples;
  string description_21;
  string description_22;
  string description_23;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffe078;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffe07c;
  undefined1 in_stack_ffffffffffffe080 [24];
  undefined8 in_stack_ffffffffffffe098;
  undefined8 in_stack_ffffffffffffe0a0;
  _Manager_type in_stack_ffffffffffffe0a8;
  undefined8 in_stack_ffffffffffffe0b0;
  _Vector_impl_data in_stack_ffffffffffffe0b8;
  undefined8 in_stack_ffffffffffffe0d0;
  pointer in_stack_ffffffffffffe0d8;
  pointer pRVar9;
  pointer in_stack_ffffffffffffe0e0;
  pointer pRVar10;
  pointer in_stack_ffffffffffffe0e8;
  pointer pRVar11;
  undefined8 in_stack_ffffffffffffe0f0;
  pointer in_stack_ffffffffffffe0f8;
  pointer pRVar12;
  pointer in_stack_ffffffffffffe100;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe108;
  pointer pRVar14;
  undefined8 in_stack_ffffffffffffe110;
  pointer in_stack_ffffffffffffe118;
  pointer pRVar15;
  pointer in_stack_ffffffffffffe120;
  pointer pRVar16;
  pointer in_stack_ffffffffffffe128;
  undefined8 in_stack_ffffffffffffe130;
  pointer in_stack_ffffffffffffe138;
  pointer in_stack_ffffffffffffe140;
  pointer in_stack_ffffffffffffe148;
  undefined1 in_stack_ffffffffffffe150 [16];
  allocator<char> local_1e8a;
  allocator<char> local_1e89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e88;
  allocator<char> local_1e6a;
  allocator<char> local_1e69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e68;
  allocator<char> local_1e4a;
  allocator<char> local_1e49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e48;
  allocator<char> local_1e2a;
  allocator<char> local_1e29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e28;
  allocator<char> local_1e0a;
  allocator<char> local_1e09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1e08;
  allocator<char> local_1dea;
  allocator<char> local_1de9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1de8;
  allocator<char> local_1dca;
  allocator<char> local_1dc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1dc8;
  allocator<char> local_1daa;
  allocator<char> local_1da9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1da8;
  allocator<char> local_1d8a;
  allocator<char> local_1d89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d88;
  allocator<char> local_1d6a;
  allocator<char> local_1d69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d68;
  allocator<char> local_1d4a;
  allocator<char> local_1d49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d48;
  allocator<char> local_1d2a;
  allocator<char> local_1d29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d28;
  allocator<char> local_1d0a;
  allocator<char> local_1d09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d08;
  allocator<char> local_1cea;
  allocator<char> local_1ce9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ce8;
  allocator<char> local_1cca;
  allocator<char> local_1cc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1cc8;
  allocator<char> local_1caa;
  allocator<char> local_1ca9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ca8;
  allocator<char> local_1c8a;
  allocator<char> local_1c89;
  RPCResults local_1c88;
  allocator_type local_1c6c;
  allocator<char> local_1c6b;
  bool local_1c6a;
  allocator<char> local_1c69;
  allocator_type local_1c68;
  allocator<char> local_1c67;
  allocator<char> local_1c66;
  allocator<char> local_1c65;
  allocator<char> local_1c64;
  allocator<char> local_1c63;
  allocator<char> local_1c62;
  allocator<char> local_1c61;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1c60;
  allocator<char> local_1c42;
  allocator<char> local_1c41;
  string local_1c40;
  string local_1c20;
  string local_1c00;
  string local_1be0;
  string local_1bc0;
  string local_1ba0;
  string local_1b80;
  string local_1b60;
  string local_1b40;
  string local_1b20;
  string local_1b00;
  string local_1ae0;
  string local_1ac0;
  string local_1aa0;
  string local_1a80;
  string local_1a60;
  string local_1a40;
  string local_1a20;
  string local_1a00;
  string local_19e0;
  string local_19c0;
  string local_19a0;
  string local_1980;
  string local_1960;
  string local_1940;
  string local_1920;
  string local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1800;
  char *local_17e0;
  size_type local_17d8;
  char local_17d0 [8];
  undefined8 uStack_17c8;
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  RPCResult local_16c0 [4];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  RPCResult local_1360 [4];
  RPCResult local_1140;
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [8];
  undefined8 local_1030;
  string local_1018 [32];
  string local_ff8 [32];
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  RPCResult local_df8 [4];
  RPCResult local_bd8;
  RPCResult local_b50;
  RPCResult local_ac8;
  RPCResult local_a40;
  RPCResult local_9b8;
  RPCResult local_930;
  RPCResult local_8a8;
  string local_820 [32];
  string local_800 [32];
  RPCResult local_7e0;
  RPCArgOptions local_758;
  string local_710 [32];
  UniValue local_6f0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_698;
  string local_638 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8 [32];
  RPCArgOptions local_5d8;
  string local_590 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_550;
  string local_4f0 [32];
  RPCArgOptions local_4d0;
  string local_488 [32];
  UniValue local_468;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  string local_3b0 [32];
  RPCArg local_390 [3];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"gettxoutsetinfo",&local_1c41);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nReturns statistics about the unspent transaction output set.\nNote this call may take some time if you are not using coinstatsindex.\n"
             ,&local_1c42);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"hash_type",&local_1c61);
  UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            (&local_468,(char (*) [18])"hash_serialized_3");
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_410,&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,
             "Which UTXO set hash should be calculated. Options: \'hash_serialized_3\' (the legacy algorithm), \'muhash\', \'none\'."
             ,&local_1c62);
  local_4d0.oneline_description._M_dataplus._M_p = (pointer)&local_4d0.oneline_description.field_2;
  local_4d0.skip_type_check = false;
  local_4d0.oneline_description._M_string_length = 0;
  local_4d0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4d0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4d0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4d0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4d0._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  name._M_string_length = in_stack_ffffffffffffe080._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffe080._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe098;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0b8._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe0b8._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe0b8._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe0d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe0d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe0e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe0e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe0f0;
  description_21._M_string_length = (size_type)in_stack_ffffffffffffe100;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0f8;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe108;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe110;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe120;
  opts._0_8_ = in_stack_ffffffffffffe118;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe128;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe130;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe138;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe140;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe148;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe150._0_8_;
  opts.hidden = (bool)in_stack_ffffffffffffe150[8];
  opts.also_positional = (bool)in_stack_ffffffffffffe150[9];
  opts._66_6_ = in_stack_ffffffffffffe150._10_6_;
  RPCArg::RPCArg(local_390,name,(Type)local_3b0,fallback,description_21,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_4f0,"hash_or_height",&local_1c63);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"the current best block",&local_1c64);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_550,&local_570);
  std::__cxx11::string::string<std::allocator<char>>
            (local_590,
             "The block hash or height of the target height (only available with coinstatsindex).",
             &local_1c65);
  local_5d8.oneline_description._M_dataplus._M_p = (pointer)&local_5d8.oneline_description.field_2;
  local_5d8.skip_type_check = true;
  local_5d8.oneline_description._M_string_length = 0;
  local_5d8.oneline_description.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"",&local_1c66);
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"string or numeric",&local_1c67);
  __l._M_len = 2;
  __l._M_array = &local_618;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5d8.type_str,__l,&local_1c68);
  local_5d8.hidden = false;
  local_5d8.also_positional = false;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  name_00._M_string_length = in_stack_ffffffffffffe080._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe098;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0b8._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe0b8._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe0b8._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe0d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe0d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe0e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe0e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe0f0;
  description_22._M_string_length = (size_type)in_stack_ffffffffffffe100;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0f8;
  description_22.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe108;
  description_22.field_2._8_8_ = in_stack_ffffffffffffe110;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe120;
  opts_00._0_8_ = in_stack_ffffffffffffe118;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe128;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe130;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe138;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe140;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe148;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe150._0_8_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe150[8];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe150[9];
  opts_00._66_6_ = in_stack_ffffffffffffe150._10_6_;
  RPCArg::RPCArg(local_390 + 1,name_00,(Type)local_4f0,fallback_00,description_22,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_638,"use_index",&local_1c69);
  local_1c6a = true;
  UniValue::UniValue<bool,_bool,_true>(&local_6f0,&local_1c6a);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_698,&local_6f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_710,"Use coinstatsindex, if available.",&local_1c6b);
  local_758.oneline_description._M_dataplus._M_p = (pointer)&local_758.oneline_description.field_2;
  local_758.skip_type_check = false;
  local_758.oneline_description._M_string_length = 0;
  local_758.oneline_description.field_2._M_local_buf[0] = '\0';
  local_758.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_758.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_758.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_758.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_758._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  name_01._M_string_length = in_stack_ffffffffffffe080._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe0a0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe098;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe0a8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe0b0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe0b8._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe0b8._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe0b8._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe0d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe0d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe0e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe0e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe0f0;
  description_23._M_string_length = (size_type)in_stack_ffffffffffffe100;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe0f8;
  description_23.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe108;
  description_23.field_2._8_8_ = in_stack_ffffffffffffe110;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe120;
  opts_01._0_8_ = in_stack_ffffffffffffe118;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe128;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe130;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe138;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe140;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe148;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe150._0_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe150[8];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe150[9];
  opts_01._66_6_ = in_stack_ffffffffffffe150._10_6_;
  RPCArg::RPCArg(local_390 + 2,name_01,(Type)local_638,fallback_01,description_23,opts_01);
  __l_00._M_len = 3;
  __l_00._M_array = local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1c60,__l_00,&local_1c6c);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"",&local_1c89);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"",&local_1c8a);
  std::__cxx11::string::string<std::allocator<char>>(local_e18,"height",&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e38,"The block height (index) of the returned statistics",&local_1caa);
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  m_key_name._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description._M_string_length = in_stack_ffffffffffffe0a0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_df8,NUM,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_e18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e58,"bestblock",&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e78,"The hash of the block at which these statistics are calculated",&local_1cca)
  ;
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffe0a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_df8 + 1,STR_HEX,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_e58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e98,"txouts",&local_1ce9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_eb8,"The number of unspent transaction outputs",&local_1cea);
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffe0a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_df8 + 2,NUM,m_key_name_01,description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_e98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ed8,"bogosize",&local_1d09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ef8,"Database-independent, meaningless metric indicating the UTXO set size",
             &local_1d0a);
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe078;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_02._M_string_length = in_stack_ffffffffffffe0a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_df8 + 3,NUM,m_key_name_02,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_ed8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f18,"hash_serialized_3",&local_1d29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f38,
             "The serialized hash (only present if \'hash_serialized_3\' hash_type is chosen)",
             &local_1d2a);
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_24_ = in_stack_ffffffffffffe080;
  auVar1._0_4_ = in_stack_ffffffffffffe07c;
  auVar1._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffe0a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_bd8,STR_HEX,(string)(auVar1 << 0x20),SUB81(local_f18,0),description_03,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  std::__cxx11::string::string<std::allocator<char>>(local_f58,"muhash",&local_1d49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f78,"The serialized hash (only present if \'muhash\' hash_type is chosen)",
             &local_1d4a);
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_24_ = in_stack_ffffffffffffe080;
  auVar2._0_4_ = in_stack_ffffffffffffe07c;
  auVar2._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe0a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_b50,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_f58,0),description_04,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  std::__cxx11::string::string<std::allocator<char>>(local_f98,"transactions",&local_1d69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fb8,
             "The number of transactions with unspent outputs (not available when coinstatsindex is used)"
             ,&local_1d6a);
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_24_ = in_stack_ffffffffffffe080;
  auVar3._0_4_ = in_stack_ffffffffffffe07c;
  auVar3._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe0a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_ac8,NUM,(string)(auVar3 << 0x20),SUB81(local_f98,0),description_05,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  std::__cxx11::string::string<std::allocator<char>>(local_fd8,"disk_size",&local_1d89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff8,
             "The estimated size of the chainstate on disk (not available when coinstatsindex is used)"
             ,&local_1d8a);
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1da8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  auVar4._4_24_ = in_stack_ffffffffffffe080;
  auVar4._0_4_ = in_stack_ffffffffffffe07c;
  auVar4._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe0a0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_a40,NUM,(string)(auVar4 << 0x20),SUB81(local_fd8,0),description_06,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1018,"total_amount",&local_1da9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1038,"The total amount of coins in the UTXO set",&local_1daa);
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1dc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_07._M_string_length = in_stack_ffffffffffffe0a0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_9b8,STR_AMOUNT,m_key_name_03,description_07,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1018,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1058,"total_unspendable_amount",&local_1dc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1078,
             "The total amount of coins permanently excluded from the UTXO set (only available if coinstatsindex is used)"
             ,&local_1dca);
  local_1de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1de8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  auVar5._4_24_ = in_stack_ffffffffffffe080;
  auVar5._0_4_ = in_stack_ffffffffffffe07c;
  auVar5._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe0a0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_930,STR_AMOUNT,(string)(auVar5 << 0x20),SUB81(local_1058,0),description_08,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1098,"block_info",&local_1de9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10b8,
             "Info on amounts in the block at this block height (only available if coinstatsindex is used)"
             ,&local_1dea);
  std::__cxx11::string::string<std::allocator<char>>(local_1380,"prevout_spent",&local_1e09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13a0,"Total amount of all prevouts spent in this block",&local_1e0a);
  local_1e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffe0a0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_1360,STR_AMOUNT,m_key_name_04,description_09,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1380,0));
  std::__cxx11::string::string<std::allocator<char>>(local_13c0,"coinbase",&local_1e29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13e0,"Coinbase subsidy amount of this block",&local_1e2a);
  local_1e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_10._M_string_length = in_stack_ffffffffffffe0a0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_1360 + 1,STR_AMOUNT,m_key_name_05,description_10,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_13c0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1400,"new_outputs_ex_coinbase",&local_1e49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1420,"Total amount of new outputs created by this block",&local_1e4a);
  local_1e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_11._M_string_length = in_stack_ffffffffffffe0a0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_1360 + 2,STR_AMOUNT,m_key_name_06,description_11,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,false);
  std::__cxx11::string::string<std::allocator<char>>(local_1440,"unspendable",&local_1e69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1460,"Total amount of unspendable outputs created in this block",&local_1e6a);
  local_1e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_12._M_string_length = in_stack_ffffffffffffe0a0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_1360 + 3,STR_AMOUNT,m_key_name_07,description_12,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1440,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1480,"unspendables",&local_1e89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_14a0,"Detailed view of the unspendable categories",&local_1e8a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_16e0,"genesis_block",(allocator<char> *)&stack0xffffffffffffe157);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1700,"The unspendable amount of the Genesis block subsidy",
             (allocator<char> *)&stack0xffffffffffffe156);
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_13._M_string_length = in_stack_ffffffffffffe0a0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_16c0,STR_AMOUNT,m_key_name_08,description_13,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_16e0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1720,"bip30",(allocator<char> *)&stack0xffffffffffffe137);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1740,"Transactions overridden by duplicates (no longer possible with BIP30)",
             (allocator<char> *)&stack0xffffffffffffe136);
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_14._M_string_length = in_stack_ffffffffffffe0a0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_16c0 + 1,STR_AMOUNT,m_key_name_09,description_14,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1720,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1760,"scripts",(allocator<char> *)&stack0xffffffffffffe117);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1780,
             "Amounts sent to scripts that are unspendable (for example OP_RETURN outputs)",
             (allocator<char> *)&stack0xffffffffffffe116);
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_15._M_string_length = in_stack_ffffffffffffe0a0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_16c0 + 2,STR_AMOUNT,m_key_name_10,description_15,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1760,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_17a0,"unclaimed_rewards",(allocator<char> *)&stack0xffffffffffffe0f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_17c0,"Fee rewards that miners did not claim in their coinbase transaction",
             (allocator<char> *)&stack0xffffffffffffe0f6);
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_11._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_16._M_string_length = in_stack_ffffffffffffe0a0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (local_16c0 + 3,STR_AMOUNT,m_key_name_11,description_16,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_17a0,0));
  __l_01._M_len = 4;
  __l_01._M_array = local_16c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe158,__l_01,
             (allocator_type *)&stack0xffffffffffffe0d7);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_12._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_12.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_17._M_string_length = in_stack_ffffffffffffe0a0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_1140,OBJ,m_key_name_12,description_17,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,
             SUB81(local_1480,0));
  __l_02._M_len = 5;
  __l_02._M_array = local_1360;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1e08,__l_02,(allocator_type *)&stack0xffffffffffffe0d6);
  uVar8 = 0;
  auVar6._4_24_ = in_stack_ffffffffffffe080;
  auVar6._0_4_ = in_stack_ffffffffffffe07c;
  auVar6._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffe0a0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_8a8,OBJ,(string)(auVar6 << 0x20),SUB81(local_1098,0),description_18,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,true);
  __l_03._M_len = 0xb;
  __l_03._M_array = local_df8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1ca8,__l_03,(allocator_type *)&stack0xffffffffffffe0d5);
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe07c;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_13._M_string_length = in_stack_ffffffffffffe080._0_8_;
  m_key_name_13.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  description_19._M_string_length = in_stack_ffffffffffffe0a0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe098;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe0a8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe0b0;
  RPCResult::RPCResult
            (&local_7e0,OBJ,m_key_name_13,description_19,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffe0b8,false);
  result._4_4_ = in_stack_ffffffffffffe07c;
  result.m_type = uVar8;
  result.m_key_name._0_24_ = in_stack_ffffffffffffe080;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe098;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe0a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe0a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe0b0;
  result._64_24_ = in_stack_ffffffffffffe0b8;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe0d0;
  result.m_description.field_2._8_8_ = pRVar9;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar10;
  result.m_cond._M_string_length = (size_type)pRVar11;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffe0f0;
  result.m_cond.field_2._8_8_ = pRVar12;
  RPCResults::RPCResults(&local_1c88,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1920,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0d4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1940,"",(allocator<char> *)&stack0xffffffffffffe0d3);
  HelpExampleCli(&local_1900,&local_1920,&local_1940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1980,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19a0,"\"none\"",(allocator<char> *)&stack0xffffffffffffe0d1);
  HelpExampleCli(&local_1960,&local_1980,&local_19a0);
  std::operator+(&local_18e0,&local_1900,&local_1960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19e0,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a00,"\"none\" 1000",(allocator<char> *)&stack0xffffffffffffe0cf);
  HelpExampleCli(&local_19c0,&local_19e0,&local_1a00);
  std::operator+(&local_18c0,&local_18e0,&local_19c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a40,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0ce);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a60,
             "\"none\" \'\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"\'",
             (allocator<char> *)&stack0xffffffffffffe0cd);
  HelpExampleCli(&local_1a20,&local_1a40,&local_1a60);
  std::operator+(&local_18a0,&local_18c0,&local_1a20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1aa0,"-named gettxoutsetinfo",
             (allocator<char> *)&stack0xffffffffffffe0cc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ac0,"hash_type=\'muhash\' use_index=\'false\'",
             (allocator<char> *)&stack0xffffffffffffe0cb);
  HelpExampleCli(&local_1a80,&local_1aa0,&local_1ac0);
  std::operator+(&local_1880,&local_18a0,&local_1a80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b00,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b20,"",(allocator<char> *)&stack0xffffffffffffe0c9);
  HelpExampleRpc(&local_1ae0,&local_1b00,&local_1b20);
  std::operator+(&local_1860,&local_1880,&local_1ae0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b60,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b80,"\"none\"",(allocator<char> *)&stack0xffffffffffffe0c7);
  HelpExampleRpc(&local_1b40,&local_1b60,&local_1b80);
  std::operator+(&local_1840,&local_1860,&local_1b40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bc0,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0c6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be0,"\"none\", 1000",(allocator<char> *)&stack0xffffffffffffe0c5);
  HelpExampleRpc(&local_1ba0,&local_1bc0,&local_1be0);
  std::operator+(&local_1820,&local_1840,&local_1ba0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c20,"gettxoutsetinfo",(allocator<char> *)&stack0xffffffffffffe0c4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c40,
             "\"none\", \"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"",
             (allocator<char> *)&stack0xffffffffffffe0c3);
  HelpExampleRpc(&local_1c00,&local_1c20,&local_1c40);
  std::operator+(&local_1800,&local_1820,&local_1c00);
  local_17e0 = local_17d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1800._M_dataplus._M_p == &local_1800.field_2) {
    uStack_17c8 = local_1800.field_2._8_8_;
  }
  else {
    local_17e0 = local_1800._M_dataplus._M_p;
  }
  local_17d8 = local_1800._M_string_length;
  local_1800._M_string_length = 0;
  local_1800.field_2._M_local_buf[0] = '\0';
  name_02._M_string_length = in_stack_ffffffffffffe080._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe080._8_16_;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe098;
  description_20.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:994:9)>
       ::_M_manager;
  description_20._M_dataplus._M_p = (pointer)0x0;
  description_20._M_string_length = 0;
  description_20.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:994:9)>
       ::_M_invoke;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe0d0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar10;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe0f0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar11;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar12;
  examples.m_examples.field_2._8_8_ = pRVar13;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe110;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar14;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar15;
  fun._M_invoker = (_Invoker_type)pRVar16;
  local_1800._M_dataplus._M_p = (pointer)&local_1800.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,description_20,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_ffffffffffffe0b8,results,examples,fun
            );
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe098);
  std::__cxx11::string::~string((string *)&local_17e0);
  std::__cxx11::string::~string((string *)&local_1800);
  std::__cxx11::string::~string((string *)&local_1c00);
  std::__cxx11::string::~string((string *)&local_1c40);
  std::__cxx11::string::~string((string *)&local_1c20);
  std::__cxx11::string::~string((string *)&local_1820);
  std::__cxx11::string::~string((string *)&local_1ba0);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::__cxx11::string::~string((string *)&local_1bc0);
  std::__cxx11::string::~string((string *)&local_1840);
  std::__cxx11::string::~string((string *)&local_1b40);
  std::__cxx11::string::~string((string *)&local_1b80);
  std::__cxx11::string::~string((string *)&local_1b60);
  std::__cxx11::string::~string((string *)&local_1860);
  std::__cxx11::string::~string((string *)&local_1ae0);
  std::__cxx11::string::~string((string *)&local_1b20);
  std::__cxx11::string::~string((string *)&local_1b00);
  std::__cxx11::string::~string((string *)&local_1880);
  std::__cxx11::string::~string((string *)&local_1a80);
  std::__cxx11::string::~string((string *)&local_1ac0);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::__cxx11::string::~string((string *)&local_1a20);
  std::__cxx11::string::~string((string *)&local_1a60);
  std::__cxx11::string::~string((string *)&local_1a40);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::__cxx11::string::~string((string *)&local_19c0);
  std::__cxx11::string::~string((string *)&local_1a00);
  std::__cxx11::string::~string((string *)&local_19e0);
  std::__cxx11::string::~string((string *)&local_18e0);
  std::__cxx11::string::~string((string *)&local_1960);
  std::__cxx11::string::~string((string *)&local_19a0);
  std::__cxx11::string::~string((string *)&local_1980);
  std::__cxx11::string::~string((string *)&local_1900);
  std::__cxx11::string::~string((string *)&local_1940);
  std::__cxx11::string::~string((string *)&local_1920);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c88.m_results);
  RPCResult::~RPCResult(&local_7e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ca8);
  lVar7 = 0x550;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_df8[0].m_type + lVar7));
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e08);
  lVar7 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1360[0].m_type + lVar7));
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe158);
  lVar7 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_16c0[0].m_type + lVar7));
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe0d8);
  std::__cxx11::string::~string(local_17c0);
  std::__cxx11::string::~string(local_17a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe0f8);
  std::__cxx11::string::~string(local_1780);
  std::__cxx11::string::~string(local_1760);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe118);
  std::__cxx11::string::~string(local_1740);
  std::__cxx11::string::~string(local_1720);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe138);
  std::__cxx11::string::~string(local_1700);
  std::__cxx11::string::~string(local_16e0);
  std::__cxx11::string::~string(local_14a0);
  std::__cxx11::string::~string(local_1480);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e88);
  std::__cxx11::string::~string(local_1460);
  std::__cxx11::string::~string(local_1440);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e68);
  std::__cxx11::string::~string(local_1420);
  std::__cxx11::string::~string(local_1400);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e48);
  std::__cxx11::string::~string(local_13e0);
  std::__cxx11::string::~string(local_13c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e28);
  std::__cxx11::string::~string(local_13a0);
  std::__cxx11::string::~string(local_1380);
  std::__cxx11::string::~string(local_10b8);
  std::__cxx11::string::~string(local_1098);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1de8);
  std::__cxx11::string::~string(local_1078);
  std::__cxx11::string::~string(local_1058);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1dc8);
  std::__cxx11::string::~string(local_1038);
  std::__cxx11::string::~string(local_1018);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1da8);
  std::__cxx11::string::~string(local_ff8);
  std::__cxx11::string::~string(local_fd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d88);
  std::__cxx11::string::~string(local_fb8);
  std::__cxx11::string::~string(local_f98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d68);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_f58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d48);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_f18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d28);
  std::__cxx11::string::~string(local_ef8);
  std::__cxx11::string::~string(local_ed8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1d08);
  std::__cxx11::string::~string(local_eb8);
  std::__cxx11::string::~string(local_e98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ce8);
  std::__cxx11::string::~string(local_e78);
  std::__cxx11::string::~string(local_e58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1cc8);
  std::__cxx11::string::~string(local_e38);
  std::__cxx11::string::~string(local_e18);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_800);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1c60);
  lVar7 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_390[0].m_names._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_758);
  std::__cxx11::string::~string(local_710);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_698);
  UniValue::~UniValue(&local_6f0);
  std::__cxx11::string::~string(local_638);
  RPCArgOptions::~RPCArgOptions(&local_5d8);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_618._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::string::~string(local_590);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string(local_4f0);
  RPCArgOptions::~RPCArgOptions(&local_4d0);
  std::__cxx11::string::~string(local_488);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_410);
  UniValue::~UniValue(&local_468);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxoutsetinfo()
{
    return RPCHelpMan{"gettxoutsetinfo",
                "\nReturns statistics about the unspent transaction output set.\n"
                "Note this call may take some time if you are not using coinstatsindex.\n",
                {
                    {"hash_type", RPCArg::Type::STR, RPCArg::Default{"hash_serialized_3"}, "Which UTXO set hash should be calculated. Options: 'hash_serialized_3' (the legacy algorithm), 'muhash', 'none'."},
                    {"hash_or_height", RPCArg::Type::NUM, RPCArg::DefaultHint{"the current best block"}, "The block hash or height of the target height (only available with coinstatsindex).",
                     RPCArgOptions{
                         .skip_type_check = true,
                         .type_str = {"", "string or numeric"},
                     }},
                    {"use_index", RPCArg::Type::BOOL, RPCArg::Default{true}, "Use coinstatsindex, if available."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "height", "The block height (index) of the returned statistics"},
                        {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at which these statistics are calculated"},
                        {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs"},
                        {RPCResult::Type::NUM, "bogosize", "Database-independent, meaningless metric indicating the UTXO set size"},
                        {RPCResult::Type::STR_HEX, "hash_serialized_3", /*optional=*/true, "The serialized hash (only present if 'hash_serialized_3' hash_type is chosen)"},
                        {RPCResult::Type::STR_HEX, "muhash", /*optional=*/true, "The serialized hash (only present if 'muhash' hash_type is chosen)"},
                        {RPCResult::Type::NUM, "transactions", /*optional=*/true, "The number of transactions with unspent outputs (not available when coinstatsindex is used)"},
                        {RPCResult::Type::NUM, "disk_size", /*optional=*/true, "The estimated size of the chainstate on disk (not available when coinstatsindex is used)"},
                        {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of coins in the UTXO set"},
                        {RPCResult::Type::STR_AMOUNT, "total_unspendable_amount", /*optional=*/true, "The total amount of coins permanently excluded from the UTXO set (only available if coinstatsindex is used)"},
                        {RPCResult::Type::OBJ, "block_info", /*optional=*/true, "Info on amounts in the block at this block height (only available if coinstatsindex is used)",
                        {
                            {RPCResult::Type::STR_AMOUNT, "prevout_spent", "Total amount of all prevouts spent in this block"},
                            {RPCResult::Type::STR_AMOUNT, "coinbase", "Coinbase subsidy amount of this block"},
                            {RPCResult::Type::STR_AMOUNT, "new_outputs_ex_coinbase", "Total amount of new outputs created by this block"},
                            {RPCResult::Type::STR_AMOUNT, "unspendable", "Total amount of unspendable outputs created in this block"},
                            {RPCResult::Type::OBJ, "unspendables", "Detailed view of the unspendable categories",
                            {
                                {RPCResult::Type::STR_AMOUNT, "genesis_block", "The unspendable amount of the Genesis block subsidy"},
                                {RPCResult::Type::STR_AMOUNT, "bip30", "Transactions overridden by duplicates (no longer possible with BIP30)"},
                                {RPCResult::Type::STR_AMOUNT, "scripts", "Amounts sent to scripts that are unspendable (for example OP_RETURN outputs)"},
                                {RPCResult::Type::STR_AMOUNT, "unclaimed_rewards", "Fee rewards that miners did not claim in their coinbase transaction"},
                            }}
                        }},
                    }},
                RPCExamples{
                    HelpExampleCli("gettxoutsetinfo", "") +
                    HelpExampleCli("gettxoutsetinfo", R"("none")") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" 1000)") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" '"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09"')") +
                    HelpExampleCli("-named gettxoutsetinfo", R"(hash_type='muhash' use_index='false')") +
                    HelpExampleRpc("gettxoutsetinfo", "") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none")") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", 1000)") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", "00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09")")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue ret(UniValue::VOBJ);

    const CBlockIndex* pindex{nullptr};
    const CoinStatsHashType hash_type{request.params[0].isNull() ? CoinStatsHashType::HASH_SERIALIZED : ParseHashType(request.params[0].get_str())};
    bool index_requested = request.params[2].isNull() || request.params[2].get_bool();

    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    active_chainstate.ForceFlushStateToDisk();

    CCoinsView* coins_view;
    BlockManager* blockman;
    {
        LOCK(::cs_main);
        coins_view = &active_chainstate.CoinsDB();
        blockman = &active_chainstate.m_blockman;
        pindex = blockman->LookupBlockIndex(coins_view->GetBestBlock());
    }

    if (!request.params[1].isNull()) {
        if (!g_coin_stats_index) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Querying specific block heights requires coinstatsindex");
        }

        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "hash_serialized_3 hash type cannot be queried for a specific block");
        }

        if (!index_requested) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot set use_index to false when querying for a specific block");
        }
        pindex = ParseHashOrHeight(request.params[1], chainman);
    }

    if (index_requested && g_coin_stats_index) {
        if (!g_coin_stats_index->BlockUntilSyncedToCurrentChain()) {
            const IndexSummary summary{g_coin_stats_index->GetSummary()};

            // If a specific block was requested and the index has already synced past that height, we can return the
            // data already even though the index is not fully synced yet.
            if (pindex->nHeight > summary.best_block_height) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, strprintf("Unable to get data because coinstatsindex is still syncing. Current height: %d", summary.best_block_height));
            }
        }
    }

    const std::optional<CCoinsStats> maybe_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex, index_requested);
    if (maybe_stats.has_value()) {
        const CCoinsStats& stats = maybe_stats.value();
        ret.pushKV("height", (int64_t)stats.nHeight);
        ret.pushKV("bestblock", stats.hashBlock.GetHex());
        ret.pushKV("txouts", (int64_t)stats.nTransactionOutputs);
        ret.pushKV("bogosize", (int64_t)stats.nBogoSize);
        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            ret.pushKV("hash_serialized_3", stats.hashSerialized.GetHex());
        }
        if (hash_type == CoinStatsHashType::MUHASH) {
            ret.pushKV("muhash", stats.hashSerialized.GetHex());
        }
        CHECK_NONFATAL(stats.total_amount.has_value());
        ret.pushKV("total_amount", ValueFromAmount(stats.total_amount.value()));
        if (!stats.index_used) {
            ret.pushKV("transactions", static_cast<int64_t>(stats.nTransactions));
            ret.pushKV("disk_size", stats.nDiskSize);
        } else {
            ret.pushKV("total_unspendable_amount", ValueFromAmount(stats.total_unspendable_amount));

            CCoinsStats prev_stats{};
            if (pindex->nHeight > 0) {
                const std::optional<CCoinsStats> maybe_prev_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex->pprev, index_requested);
                if (!maybe_prev_stats) {
                    throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
                }
                prev_stats = maybe_prev_stats.value();
            }

            UniValue block_info(UniValue::VOBJ);
            block_info.pushKV("prevout_spent", ValueFromAmount(stats.total_prevout_spent_amount - prev_stats.total_prevout_spent_amount));
            block_info.pushKV("coinbase", ValueFromAmount(stats.total_coinbase_amount - prev_stats.total_coinbase_amount));
            block_info.pushKV("new_outputs_ex_coinbase", ValueFromAmount(stats.total_new_outputs_ex_coinbase_amount - prev_stats.total_new_outputs_ex_coinbase_amount));
            block_info.pushKV("unspendable", ValueFromAmount(stats.total_unspendable_amount - prev_stats.total_unspendable_amount));

            UniValue unspendables(UniValue::VOBJ);
            unspendables.pushKV("genesis_block", ValueFromAmount(stats.total_unspendables_genesis_block - prev_stats.total_unspendables_genesis_block));
            unspendables.pushKV("bip30", ValueFromAmount(stats.total_unspendables_bip30 - prev_stats.total_unspendables_bip30));
            unspendables.pushKV("scripts", ValueFromAmount(stats.total_unspendables_scripts - prev_stats.total_unspendables_scripts));
            unspendables.pushKV("unclaimed_rewards", ValueFromAmount(stats.total_unspendables_unclaimed_rewards - prev_stats.total_unspendables_unclaimed_rewards));
            block_info.pushKV("unspendables", std::move(unspendables));

            ret.pushKV("block_info", std::move(block_info));
        }
    } else {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
    }
    return ret;
},
    };
}